

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

token * get_next_token(Source_File *src,automata_entry *start_state,char skip_new_line)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  KEYWORDS KVar5;
  char cVar6;
  token *ptVar7;
  KEYWORDS kw;
  automata_entry *paVar8;
  automata_entry *paVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  skip_white_space(src,skip_new_line);
  src->token_size = 0;
  src->best_token_size = 0;
  uVar1 = src->which_column;
  uVar3 = src->which_row;
  auVar10._8_4_ = (int)uVar1;
  auVar10._0_8_ = uVar3;
  auVar10._12_4_ = (int)((ulong)uVar1 >> 0x20);
  src->best_token_line = uVar3;
  src->best_token_column = auVar10._8_8_;
  src->best_token_where_in_src_end = src->where_in_src;
  src->best_token_where_in_src_start = src->where_in_src;
  paVar9 = start_state;
  paVar8 = start_state;
  while( true ) {
    cVar6 = src_getc(src,'\x01','\0','\0');
    if ((cVar6 == '\0') || (cVar6 == '\n' && skip_new_line == '\0')) break;
    paVar9 = paVar9->delta[cmpr[cVar6]];
    if (paVar9 == (automata_entry *)0x0) {
      kw = paVar8->type;
      if ((kw != PKW_COMMENT) && (kw != KW_COMMENT)) goto LAB_00145b14;
      src->token_size = 0;
      src->best_token_size = 0;
      uVar2 = src->which_column;
      uVar4 = src->which_row;
      auVar11._8_4_ = (int)uVar2;
      auVar11._0_8_ = uVar4;
      auVar11._12_4_ = (int)((ulong)uVar2 >> 0x20);
      src->best_token_line = uVar4;
      src->best_token_column = auVar11._8_8_;
      src->where_in_src = src->best_token_where_in_src_end;
      src->best_token_where_in_src_start = src->best_token_where_in_src_end;
      skip_white_space(src,'\x01');
      paVar9 = start_state;
      paVar8 = start_state;
    }
    else if (paVar9->is_final != '\0') {
      src_assimilate_into_best_token(src);
      paVar8 = paVar9;
    }
  }
  KVar5 = paVar8->type;
  kw = KW_NOTYPE;
  if ((KVar5 != KW_COMMENT) && (KVar5 != PKW_COMMENT)) {
    kw = KVar5;
  }
LAB_00145b14:
  ptVar7 = src_extract_token(src,kw);
  return ptVar7;
}

Assistant:

struct token* get_next_token(struct Source_File *src,struct automata_entry *start_state,char skip_new_line)
{
	int temp;
	char hold_char;

	struct token *ret;
	struct automata_entry *current_state;
	struct automata_entry *best_state;

	/*ignore leading spaces,tabs and newlines*/
	skip_white_space(src,skip_new_line);

	src_reset_token_data(src,1);

	best_state=current_state=start_state;


	while( (hold_char=src_getc(src,1,0,0)) !='\0')
	{
		if(hold_char=='\n' && !skip_new_line)
		{
			break;
		}
		current_state=current_state->delta[cmpr[hold_char]];
		if(current_state==NULL)
		{
			if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
			{
				/*TODO account for new lines not counted in comment*/
				src_reset_token_data(src,0);
				best_state=current_state=start_state;
				skip_white_space(src,1);
			}else
			{
				return src_extract_token(src,best_state->type);
			}

		}else
		{
			if(current_state->is_final)
			{
				best_state=current_state;
				src_assimilate_into_best_token(src);
			}
		}
	}

	if(best_state->type==KW_COMMENT || best_state->type==PKW_COMMENT)
	{
		return src_extract_token(src,KW_NOTYPE);
	}else
	{
		return src_extract_token(src,best_state->type);
	}
	return ret;
}